

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O1

void vocdelinh(voccxdef *ctx)

{
  uint uVar1;
  vocdef *pvVar2;
  bool bVar3;
  vocdef **ppvVar4;
  int iVar5;
  uint *puVar6;
  vocdef *pvVar7;
  vocdef *pvVar8;
  vocdef **ppvVar9;
  vocdef **ppvVar10;
  uint uVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  
  ppvVar4 = ctx->voccxhsh;
  iVar5 = 0x100;
  do {
    if (*ppvVar4 != (vocdef *)0x0) {
      pvVar7 = *ppvVar4;
      ppvVar10 = (vocdef **)0x0;
      do {
        uVar11 = pvVar7->vocwlst;
        if (uVar11 == 0xffffffff) {
          puVar12 = (uint *)0x0;
        }
        else {
          puVar12 = (uint *)((long)&ctx->voccxwp[(ulong)uVar11 / 2000]->vocwnxt +
                            (ulong)(uVar11 % 2000 << 3));
        }
        pvVar2 = pvVar7->vocnxt;
        pvVar8 = pvVar7;
        if (puVar12 != (uint *)0x0) {
          ppvVar9 = ppvVar10;
          if (ppvVar10 == (vocdef **)0x0) {
            ppvVar9 = ppvVar4;
          }
          bVar3 = false;
          puVar14 = (uint *)0x0;
          do {
            uVar1 = *puVar12;
            if (uVar1 == 0xffffffff) {
              puVar13 = (uint *)0x0;
            }
            else {
              puVar13 = (uint *)((long)&ctx->voccxwp[(ulong)uVar1 / 2000]->vocwnxt +
                                (ulong)(uVar1 % 2000 << 3));
            }
            puVar6 = puVar12;
            if ((*(byte *)((long)puVar12 + 7) & 2) != 0) {
              puVar6 = puVar14;
              if (puVar14 == (uint *)0x0) {
                puVar6 = &pvVar7->vocwlst;
              }
              *puVar6 = uVar1;
              *puVar12 = ctx->voccxwfre;
              ctx->voccxwfre = uVar11;
              puVar6 = puVar14;
              if (pvVar7->vocwlst == 0xffffffff) {
                *ppvVar9 = pvVar7->vocnxt;
                pvVar7->vocnxt = ctx->voccxfre;
                ctx->voccxfre = pvVar7;
                bVar3 = true;
              }
            }
            puVar12 = puVar13;
            puVar14 = puVar6;
            uVar11 = uVar1;
          } while (puVar13 != (uint *)0x0);
          if (bVar3) {
            pvVar8 = (vocdef *)ppvVar10;
          }
        }
        pvVar7 = pvVar2;
        ppvVar10 = &pvVar8->vocnxt;
      } while (pvVar2 != (vocdef *)0x0);
    }
    ppvVar4 = ppvVar4 + 1;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void vocdelinh(voccxdef *ctx)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      idx;
    uint      nxtidx;
    int       deleted_vocdef;
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            nxt = v->vocnxt;
            deleted_vocdef = FALSE;

            /* go through each vocwdef relation in the word's list */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember the next item in the vocwdef list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /* delete word if it's inherited */
                if (vw->vocwflg & VOCFINH)
                {
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        /* unlink from hash chain */
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                        
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                    prvw = vw;  /* this one is still in list - it's now prv */
            }

            /* if we didn't delete this vocdef, advance prv onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}